

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_sse2.c
# Opt level: O1

void av1_highbd_apply_temporal_filter_sse2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  short *psVar1;
  short *psVar2;
  int *piVar3;
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  uint8_t *puVar9;
  byte bVar10;
  byte bVar11;
  char cVar12;
  byte bVar13;
  byte bVar14;
  uint16_t *puVar15;
  uint32_t *puVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  undefined7 in_register_00000011;
  long lVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  undefined1 *puVar26;
  long lVar27;
  int *piVar28;
  ulong uVar29;
  int *piVar30;
  ulong uVar31;
  int iVar32;
  int *piVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int subblock_idx;
  long lVar37;
  ulong uVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  double dVar45;
  undefined1 auVar44 [16];
  double dVar46;
  int iVar48;
  undefined1 auVar47 [16];
  int iVar49;
  double dVar50;
  undefined1 auVar51 [16];
  int iVar52;
  int iVar54;
  undefined1 auVar53 [16];
  double d_factor [4];
  double d_factor_decayed [4];
  double subblock_mses_scaled [4];
  uint32_t luma_sse_sum [1024];
  uint32_t acc_5x5_sse [32] [32];
  uint32_t frame_sse [1152];
  uint local_3438;
  int local_340c;
  int aiStack_33b8 [2];
  undefined8 local_33b0;
  int local_33a8 [7];
  int iStack_338c;
  int local_3388;
  int iStack_3384;
  int iStack_3380;
  int iStack_337c;
  int local_3378;
  int iStack_3374;
  int iStack_3370;
  int iStack_336c;
  int local_3368 [24];
  double local_3308;
  undefined8 uStack_3300;
  ulong local_32f0;
  macroblockd_plane *local_32e8;
  long local_32e0;
  YV12_BUFFER_CONFIG *local_32d8;
  ulong local_32d0;
  uint16_t *local_32c8;
  uint32_t *local_32c0;
  ulong local_32b8;
  ulong local_32b0;
  ulong local_32a8;
  ulong local_32a0;
  double local_3298 [4];
  double adStack_3278 [4];
  double adStack_3258 [4];
  int local_3238 [1024];
  undefined1 local_2238 [8];
  int aiStack_2230 [1022];
  int local_1238 [1154];
  
  uVar31 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar5 = block_size_high[uVar31];
  bVar6 = block_size_wide[uVar31];
  iVar34 = (frame_to_filter->field_2).field_0.y_crop_width;
  iVar35 = (frame_to_filter->field_3).field_0.y_crop_height;
  if (iVar35 < iVar34) {
    iVar34 = iVar35;
  }
  dVar50 = (double)q_factor / 20.0;
  dVar50 = dVar50 * dVar50;
  dVar43 = 1.0;
  if (dVar50 <= 1.0) {
    dVar43 = dVar50;
  }
  dVar46 = (double)q_factor * 0.015625;
  local_33b0 = dVar46 * dVar46 * 0.5;
  local_3308 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  uStack_3300 = 0;
  dVar46 = 1.0;
  if (local_3308 <= 1.0) {
    dVar46 = local_3308;
  }
  local_3298[2] = 0.0;
  local_3298[3] = 0.0;
  local_3298[0] = 0.0;
  local_3298[1] = 0.0;
  lVar37 = 0;
  local_32d8 = frame_to_filter;
  memset(local_1238,0,0x1200);
  memset(local_3238,0,0x1000);
  local_32e0 = (long)pred * 2;
  auVar44._0_8_ = (double)iVar34 * 0.1;
  auVar44._8_8_ = 0;
  if (auVar44._0_8_ <= 1.0) {
    auVar44 = ZEXT816(0x3ff0000000000000);
  }
  auVar53._0_8_ = auVar44._0_8_;
  do {
    auVar40 = pshuflw(ZEXT416((uint)subblock_mvs[lVar37]),ZEXT416((uint)subblock_mvs[lVar37]),0x60);
    dVar42 = (double)(auVar40._0_4_ >> 0x10);
    dVar45 = (double)(auVar40._4_4_ >> 0x10);
    dVar42 = dVar45 * dVar45 + dVar42 * dVar42;
    if (dVar42 < 0.0) {
      dVar42 = sqrt(dVar42);
      auVar53._8_8_ = 0;
      auVar44 = auVar53;
    }
    else {
      dVar42 = SQRT(dVar42);
    }
    dVar42 = dVar42 / auVar44._0_8_;
    if (dVar42 <= 1.0) {
      dVar42 = 1.0;
    }
    local_3298[lVar37] = dVar42;
    lVar37 = lVar37 + 1;
  } while (lVar37 != 4);
  if (q_factor < 0x80) {
    local_33b0 = (double)(-(ulong)(dVar50 < 1e-05) & 0x3ee4f8b588e368f1 |
                         ~-(ulong)(dVar50 < 1e-05) & (ulong)dVar43);
  }
  if (0 < num_planes) {
    uStack_3300 = 0;
    local_3308 = (double)(~-(ulong)(local_3308 < 1e-05) & (ulong)dVar46 |
                         -(ulong)(local_3308 < 1e-05) & 0x3ee4f8b588e368f1);
    local_32e8 = mbd->plane;
    local_32f0 = (ulong)(uint)num_planes;
    uVar31 = 0;
    local_340c = 0;
    do {
      bVar13 = bVar5 >> ((byte)local_32e8[uVar31].subsampling_y & 0x1f);
      uVar17 = (uint)bVar13;
      bVar14 = bVar6 >> ((byte)local_32e8[uVar31].subsampling_x & 0x1f);
      uVar19 = (ulong)bVar14;
      iVar34 = local_32e8[uVar31].subsampling_x - mbd->plane[0].subsampling_x;
      iVar35 = local_32e8[uVar31].subsampling_y - mbd->plane[0].subsampling_y;
      bVar10 = (byte)iVar34;
      bVar11 = (byte)iVar35;
      dVar43 = 0.04;
      if (uVar31 != 0) {
        dVar43 = 1.0 / (double)((1 << (bVar10 + bVar11 & 0x1f)) + 0x19);
      }
      uVar8 = *(uint *)((long)local_32d8->store_buf_adr + (ulong)(uVar31 != 0) * 4 + -0x28);
      puVar9 = local_32d8->store_buf_adr[uVar31 - 4];
      dVar50 = log(noise_levels[uVar31] + noise_levels[uVar31] + 5.0);
      if ((uVar31 == 1) && (uVar17 != 0)) {
        uVar18 = 1 << (bVar11 & 0x1f);
        uVar21 = 1 << (bVar10 & 0x1f);
        if ((int)uVar21 < 2) {
          uVar21 = 1;
        }
        if ((int)uVar18 < 2) {
          uVar18 = 1;
        }
        uVar25 = 0;
        do {
          if (bVar14 != 0) {
            uVar29 = 0;
            do {
              if (iVar35 != 0x1f) {
                iVar32 = ((int)uVar29 << (bVar10 & 0x1f)) +
                         ((int)uVar25 << (bVar11 & 0x1f)) * 0x24 + 2;
                lVar37 = uVar29 + uVar25 * 0x20;
                uVar23 = 0;
                do {
                  if (iVar34 != 0x1f) {
                    iVar36 = local_3238[lVar37];
                    uVar38 = (ulong)uVar21;
                    iVar24 = iVar32;
                    do {
                      iVar36 = iVar36 + local_1238[iVar24];
                      iVar24 = iVar24 + 1;
                      uVar38 = uVar38 - 1;
                    } while (uVar38 != 0);
                    local_3238[lVar37] = iVar36;
                  }
                  uVar23 = uVar23 + 1;
                  iVar32 = iVar32 + 0x24;
                } while (uVar23 != uVar18);
              }
              uVar29 = uVar29 + 1;
            } while (uVar29 != uVar19);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar17);
      }
      lVar20 = (long)local_340c;
      lVar37 = local_32e0 + lVar20 * 2;
      iVar34 = mbd->bd;
      local_3438 = (uint)bVar14;
      uVar21 = local_3438;
      if (uVar17 != 0) {
        lVar22 = (long)(int)(local_3438 * mb_col + uVar8 * uVar17 * mb_row) * 2 + (long)puVar9 * 2;
        uVar18 = 0;
        piVar28 = local_1238;
        lVar27 = lVar37;
        do {
          if (local_3438 != 0) {
            uVar25 = 0;
            do {
              psVar1 = (short *)(lVar22 + uVar25 * 2);
              psVar2 = (short *)(lVar27 + uVar25 * 2);
              auVar40._0_2_ = *psVar1 - *psVar2;
              auVar40._2_2_ = psVar1[1] - psVar2[1];
              auVar40._4_2_ = psVar1[2] - psVar2[2];
              auVar40._6_2_ = psVar1[3] - psVar2[3];
              auVar40._8_2_ = psVar1[4] - psVar2[4];
              auVar40._10_2_ = psVar1[5] - psVar2[5];
              auVar40._12_2_ = psVar1[6] - psVar2[6];
              auVar40._14_2_ = psVar1[7] - psVar2[7];
              auVar44 = pmulhw(auVar40,auVar40);
              auVar47._2_2_ = auVar44._8_2_;
              auVar47._0_2_ = auVar40._8_2_ * auVar40._8_2_;
              auVar47._4_2_ = auVar40._10_2_ * auVar40._10_2_;
              auVar47._6_2_ = auVar44._10_2_;
              auVar47._8_2_ = auVar40._12_2_ * auVar40._12_2_;
              auVar47._10_2_ = auVar44._12_2_;
              auVar47._12_2_ = auVar40._14_2_ * auVar40._14_2_;
              auVar47._14_2_ = auVar44._14_2_;
              piVar33 = piVar28 + uVar25 + 2;
              *(short *)piVar33 = auVar40._0_2_ * auVar40._0_2_;
              *(short *)((long)piVar33 + 2) = auVar44._0_2_;
              *(short *)(piVar33 + 1) = auVar40._2_2_ * auVar40._2_2_;
              *(short *)((long)piVar33 + 6) = auVar44._2_2_;
              *(short *)(piVar33 + 2) = auVar40._4_2_ * auVar40._4_2_;
              *(short *)((long)piVar33 + 10) = auVar44._4_2_;
              *(short *)(piVar33 + 3) = auVar40._6_2_ * auVar40._6_2_;
              *(short *)((long)piVar33 + 0xe) = auVar44._6_2_;
              *(undefined1 (*) [16])(piVar28 + uVar25 + 6) = auVar47;
              uVar25 = uVar25 + 8;
            } while (uVar25 < uVar19);
          }
          piVar28 = piVar28 + 0x24;
          uVar18 = uVar18 + 1;
          lVar27 = lVar27 + (ulong)(local_3438 * 2);
          lVar22 = lVar22 + (ulong)uVar8 * 2;
        } while (uVar18 != uVar17);
      }
      if (local_3438 != 0) {
        puVar26 = local_2238 + (ulong)bVar13 * 0x80;
        piVar28 = aiStack_2230;
        uVar25 = 0;
        do {
          lVar22 = 0x50;
          piVar33 = local_1238 + uVar25;
          do {
            piVar30 = piVar33;
            iVar35 = piVar30[2];
            iVar32 = piVar30[3];
            iVar36 = *piVar30;
            iVar24 = piVar30[1];
            if (uVar25 == 0) {
              iVar36 = iVar35;
              iVar24 = iVar35;
            }
            iVar52 = piVar30[4];
            iVar54 = piVar30[5];
            iVar48 = piVar30[6];
            iVar49 = piVar30[7];
            *(int *)((long)aiStack_33b8 + lVar22) = iVar36;
            *(int *)((long)aiStack_33b8 + lVar22 + 4) = iVar24;
            *(int *)((long)&local_33b0 + lVar22) = iVar35;
            *(int *)((long)&local_33b0 + lVar22 + 4) = iVar32;
            if ((long)(int)(local_3438 - 4) <= (long)uVar25) {
              iVar48 = iVar54;
              iVar49 = iVar54;
            }
            *(int *)((long)local_33a8 + lVar22) = iVar52;
            *(int *)((long)local_33a8 + lVar22 + 4) = iVar54;
            *(int *)((long)local_33a8 + lVar22 + 8) = iVar48;
            *(int *)((long)local_33a8 + lVar22 + 0xc) = iVar49;
            lVar22 = lVar22 + 0x20;
            piVar33 = piVar30 + 0x24;
          } while (lVar22 != 0xb0);
          local_33a8[0] = local_3368[0];
          local_33a8[1] = local_3368[1];
          local_33a8[2] = local_3368[2];
          local_33a8[3] = local_3368[3];
          local_33a8[4] = local_3368[4];
          local_33a8[5] = local_3368[5];
          local_33a8[6] = local_3368[6];
          iStack_338c = local_3368[7];
          local_3388 = local_3368[0];
          iStack_3384 = local_3368[1];
          iStack_3380 = local_3368[2];
          iStack_337c = local_3368[3];
          local_3378 = local_3368[4];
          iStack_3374 = local_3368[5];
          iStack_3370 = local_3368[6];
          iStack_336c = local_3368[7];
          if (3 < uVar17) {
            lVar22 = 0;
            piVar33 = piVar28;
            iVar35 = local_3368[4];
            iVar32 = local_3368[5];
            iVar36 = local_3368[6];
            iVar24 = local_3368[7];
            do {
              iStack_336c = local_3368[7];
              iStack_3370 = local_3368[6];
              iStack_3374 = local_3368[5];
              local_3378 = local_3368[4];
              local_3368[7] = local_3368[0xf];
              local_3368[6] = local_3368[0xe];
              local_3368[5] = local_3368[0xd];
              local_3368[4] = local_3368[0xc];
              local_3368[0xf] = local_3368[0x17];
              local_3368[0xe] = local_3368[0x16];
              local_3368[0xd] = local_3368[0x15];
              local_3368[0xc] = local_3368[0x14];
              iVar49 = iStack_337c;
              iVar48 = iStack_3380;
              iVar54 = iStack_3384;
              iVar52 = local_3388;
              iStack_337c = local_3368[3];
              iStack_3380 = local_3368[2];
              iStack_3384 = local_3368[1];
              local_3388 = local_3368[0];
              local_3368[3] = local_3368[0xb];
              local_3368[2] = local_3368[10];
              local_3368[1] = local_3368[9];
              local_3368[0] = local_3368[8];
              local_3368[0xb] = local_3368[0x13];
              local_3368[10] = local_3368[0x12];
              local_3368[9] = local_3368[0x11];
              local_3368[8] = local_3368[0x10];
              local_33a8[1] = iVar54 + iStack_3384 + local_3368[1] + local_3368[9] + local_33a8[1];
              local_33a8[2] = iVar48 + iStack_3380 + local_3368[2] + local_3368[10] + local_33a8[2];
              local_33a8[3] = iVar49 + iStack_337c + local_3368[3] + local_3368[0xb] + local_33a8[3]
              ;
              local_33a8[4] = iVar35 + local_3378 + local_3368[4] + local_3368[0xc] + local_33a8[4];
              local_33a8[5] = iVar32 + iStack_3374 + local_3368[5] + local_3368[0xd] + local_33a8[5]
              ;
              local_33a8[6] = iVar36 + iStack_3370 + local_3368[6] + local_3368[0xe] + local_33a8[6]
              ;
              piVar3 = (int *)((long)(piVar30 + 0x24) + lVar22);
              local_3368[0x12] = piVar3[2];
              local_3368[0x13] = piVar3[3];
              local_3368[0x10] = *piVar3;
              local_3368[0x11] = piVar3[1];
              if (uVar25 == 0) {
                local_3368[0x10] = local_3368[0x12];
                local_3368[0x11] = local_3368[0x12];
              }
              piVar3 = (int *)((long)piVar30 + lVar22 + 0xa0);
              local_3368[0x14] = *piVar3;
              local_3368[0x15] = piVar3[1];
              local_3368[0x16] = piVar3[2];
              local_3368[0x17] = piVar3[3];
              if ((long)(int)(local_3438 - 4) <= (long)uVar25) {
                local_3368[0x16] = local_3368[0x15];
                local_3368[0x17] = local_3368[0x15];
              }
              piVar33[-2] = local_33a8[3] + local_33a8[1] +
                            local_33a8[2] +
                            local_33a8[4] +
                            iVar52 + local_3388 + local_3368[0] + local_3368[8] + local_33a8[0];
              piVar33[-1] = local_33a8[3] + local_33a8[5] + local_33a8[1] +
                            local_33a8[2] + local_33a8[4];
              *piVar33 = local_33a8[3] + local_33a8[5] +
                         local_33a8[6] + local_33a8[2] + local_33a8[4];
              piVar33[1] = local_33a8[3] +
                           iVar24 + iStack_336c + local_3368[7] + local_3368[0xf] + iStack_338c +
                           local_33a8[5] + local_33a8[6] + local_33a8[4];
              lVar22 = lVar22 + 0x90;
              piVar33 = piVar33 + 0x20;
              iVar35 = local_3378;
              iVar32 = iStack_3374;
              iVar36 = iStack_3370;
              iVar24 = iStack_336c;
              local_33a8[0] = iVar52;
              local_33a8[1] = iVar54;
              local_33a8[2] = iVar48;
              local_33a8[3] = iVar49;
              local_33a8[4] = iVar35;
              local_33a8[5] = iVar32;
              local_33a8[6] = iVar36;
              iStack_338c = iVar24;
            } while ((ulong)(uVar17 - 3) * 0x90 != lVar22);
          }
          lVar22 = -0x180;
          do {
            iVar49 = iStack_336c;
            iVar48 = iStack_3370;
            iVar54 = iStack_3374;
            iVar52 = local_3378;
            iStack_336c = local_3368[7];
            iStack_3370 = local_3368[6];
            iStack_3374 = local_3368[5];
            local_3378 = local_3368[4];
            local_3368[7] = local_3368[0xf];
            local_3368[6] = local_3368[0xe];
            local_3368[5] = local_3368[0xd];
            local_3368[4] = local_3368[0xc];
            iVar24 = iStack_337c;
            iVar36 = iStack_3380;
            iVar32 = iStack_3384;
            iVar35 = local_3388;
            iStack_337c = local_3368[3];
            iStack_3380 = local_3368[2];
            iStack_3384 = local_3368[1];
            local_3388 = local_3368[0];
            local_3368[3] = local_3368[0xb];
            local_3368[2] = local_3368[10];
            local_3368[1] = local_3368[9];
            local_3368[0] = local_3368[8];
            auVar51._0_4_ = local_3388 + local_3368[0] + iVar35 + local_3368[0x10] + local_33a8[0];
            auVar51._4_4_ = iStack_3384 + local_3368[1] + iVar32 + local_3368[0x11] + local_33a8[1];
            auVar51._8_4_ = iStack_3380 + local_3368[2] + iVar36 + local_3368[0x12] + local_33a8[2];
            auVar51._12_4_ = iStack_337c + local_3368[3] + iVar24 + local_3368[0x13] + local_33a8[3]
            ;
            local_33a8[4] = local_3378 + local_3368[4] + iVar52 + local_3368[0x14] + local_33a8[4];
            local_33a8[5] = iStack_3374 + local_3368[5] + iVar54 + local_3368[0x15] + local_33a8[5];
            local_33a8[6] = iStack_3370 + local_3368[6] + iVar48 + local_3368[0x16] + local_33a8[6];
            auVar53 = auVar51 & _DAT_00570c40;
            auVar44 = auVar51 & _DAT_00570c60;
            piVar33 = (int *)(puVar26 + lVar22);
            *piVar33 = auVar51._12_4_ + auVar51._4_4_ +
                       auVar51._8_4_ + local_33a8[4] + auVar51._0_4_;
            piVar33[1] = auVar53._12_4_ + local_33a8[5] + auVar53._4_4_ +
                         auVar53._8_4_ + local_33a8[4] + auVar53._0_4_;
            piVar33[2] = auVar51._12_4_ + local_33a8[5] +
                         local_33a8[6] + auVar51._8_4_ + local_33a8[4];
            piVar33[3] = auVar44._12_4_ +
                         iStack_336c + local_3368[7] + iVar49 + local_3368[0x17] + iStack_338c +
                         auVar44._4_4_ + local_33a8[5] +
                         auVar44._8_4_ + local_33a8[6] + auVar44._0_4_ + local_33a8[4];
            lVar22 = lVar22 + 0x80;
            local_3368[8] = local_3368[0x10];
            local_3368[9] = local_3368[0x11];
            local_3368[10] = local_3368[0x12];
            local_3368[0xb] = local_3368[0x13];
            local_3368[0xc] = local_3368[0x14];
            local_3368[0xd] = local_3368[0x15];
            local_3368[0xe] = local_3368[0x16];
            local_3368[0xf] = local_3368[0x17];
            local_33a8[0] = iVar35;
            local_33a8[1] = iVar32;
            local_33a8[2] = iVar36;
            local_33a8[3] = iVar24;
            local_33a8[4] = iVar52;
            local_33a8[5] = iVar54;
            local_33a8[6] = iVar48;
            iStack_338c = iVar49;
          } while (lVar22 != 0);
          local_3368[8] = local_3368[0x10];
          local_3368[9] = local_3368[0x11];
          local_3368[10] = local_3368[0x12];
          local_3368[0xb] = local_3368[0x13];
          local_3368[0xc] = local_3368[0x14];
          local_3368[0xd] = local_3368[0x15];
          local_3368[0xe] = local_3368[0x16];
          local_3368[0xf] = local_3368[0x17];
          uVar25 = uVar25 + 4;
          piVar28 = piVar28 + 4;
          puVar26 = puVar26 + 0x10;
        } while (uVar25 < uVar19);
      }
      dVar50 = 1.0 / ((dVar50 + 0.5) * local_33b0 * local_3308);
      lVar22 = 0;
      do {
        uVar4 = *(undefined8 *)(subblock_mses + lVar22);
        adStack_3258[lVar22] = (double)(int)uVar4 * (double)DAT_00570b30;
        adStack_3258[lVar22 + 1] = (double)(int)((ulong)uVar4 >> 0x20) * DAT_00570b30._8_8_;
        auVar41._0_8_ = local_3298[lVar22] * dVar50;
        auVar41._8_8_ = local_3298[lVar22 + 1] * dVar50;
        *(undefined1 (*) [16])(adStack_3278 + lVar22) = auVar41;
        lVar22 = lVar22 + 2;
      } while (lVar22 != 4);
      cVar12 = (char)iVar34;
      local_3438 = (uint)bVar14;
      local_32d0 = uVar31;
      if (tf_wgt_calc_lvl == 0) {
        if (uVar17 != 0) {
          local_32a8 = (ulong)(bVar13 >> 1);
          local_32b8 = (ulong)(uVar21 * 2);
          local_32c0 = accum + lVar20;
          local_32c8 = count + lVar20;
          uVar31 = 0;
          puVar26 = local_2238;
          piVar28 = local_3238;
          iVar34 = 0;
          auVar44 = _DAT_004d8490;
          local_32b0 = (ulong)uVar17;
          do {
            puVar16 = local_32c0;
            puVar15 = local_32c8;
            bVar39 = local_32a8 <= uVar31;
            if (local_3438 != 0) {
              uVar25 = 0;
              local_32a0 = uVar31;
              do {
                uVar7 = *(ushort *)(lVar37 + uVar25 * 2);
                uVar31 = (ulong)(((uint)(bVar14 >> 1 <= uVar25) | (uint)bVar39 * 2) << 3);
                dVar50 = ((double)((uint)(piVar28[uVar25] + *(int *)(puVar26 + uVar25 * 4)) >>
                                  (cVar12 * '\x02' - 0x10U & 0x1f)) * dVar43 * 0.041666666666666664
                         + *(double *)((long)adStack_3258 + uVar31)) *
                         *(double *)((long)adStack_3278 + uVar31);
                uVar31 = -(ulong)(dVar50 < 7.0);
                dVar50 = exp((double)(~uVar31 & 0xc01c000000000000 |
                                     ((ulong)dVar50 ^ auVar44._0_8_) & uVar31));
                auVar44 = _DAT_004d8490;
                puVar15[(long)iVar34 + uVar25] =
                     puVar15[(long)iVar34 + uVar25] + (short)(int)(dVar50 * 1000.0);
                puVar16[(long)iVar34 + uVar25] =
                     puVar16[(long)iVar34 + uVar25] + (uint)uVar7 * (int)(dVar50 * 1000.0);
                uVar25 = uVar25 + 1;
              } while (uVar19 != uVar25);
              iVar34 = iVar34 + (int)uVar25;
              uVar31 = local_32a0;
            }
            uVar31 = uVar31 + 1;
            piVar28 = piVar28 + 0x20;
            puVar26 = puVar26 + 0x80;
            lVar37 = lVar37 + local_32b8;
          } while (uVar31 != local_32b0);
        }
      }
      else if (uVar17 != 0) {
        uVar31 = 0;
        puVar26 = local_2238;
        piVar28 = local_3238;
        iVar34 = 0;
        do {
          if (uVar21 != 0) {
            uVar25 = 0;
            do {
              uVar29 = (ulong)(((uint)(bVar14 >> 1 <= uVar25) | (uint)(bVar13 >> 1 <= uVar31) * 2)
                              << 3);
              dVar50 = ((double)((uint)(piVar28[uVar25] + *(int *)(puVar26 + uVar25 * 4)) >>
                                (cVar12 * '\x02' - 0x10U & 0x1f)) * dVar43 * 0.041666666666666664 +
                       *(double *)((long)adStack_3258 + uVar29)) *
                       *(double *)((long)adStack_3278 + uVar29);
              if (7.0 <= dVar50) {
                dVar50 = 7.0;
              }
              iVar35 = (int)((float)((int)((float)dVar50 * -12102203.0) + 0x3f7f127f) * 1000.0 + 0.5
                            );
              uVar7 = *(ushort *)(lVar37 + uVar25 * 2);
              count[lVar20 + (long)iVar34 + uVar25] =
                   count[lVar20 + (long)iVar34 + uVar25] + (short)iVar35;
              accum[lVar20 + (long)iVar34 + uVar25] =
                   accum[lVar20 + (long)iVar34 + uVar25] + (uint)uVar7 * iVar35;
              uVar25 = uVar25 + 1;
            } while (uVar19 != uVar25);
            iVar34 = iVar34 + (int)uVar25;
          }
          uVar31 = uVar31 + 1;
          piVar28 = piVar28 + 0x20;
          puVar26 = puVar26 + 0x80;
          lVar37 = lVar37 + (ulong)(uVar21 * 2);
        } while (uVar31 != uVar17);
      }
      local_340c = local_340c + local_3438 * uVar17;
      uVar31 = local_32d0 + 1;
    } while (uVar31 != local_32f0);
  }
  return;
}

Assistant:

void av1_highbd_apply_temporal_filter_sse2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with sse2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with sse2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint32_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };
  uint16_t *pred1 = CONVERT_TO_SHORTPTR(pred);

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint16_t *ref =
        CONVERT_TO_SHORTPTR(frame_to_filter->buffers[plane]) + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[0].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[0].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx + 2];
            }
          }
        }
      }
    }

    highbd_apply_temporal_filter(
        ref, frame_stride, pred1 + plane_offset, plane_w, plane_w, plane_h,
        subblock_mses, accum + plane_offset, count + plane_offset, frame_sse,
        luma_sse_sum, mbd->bd, inv_num_ref_pixels, decay_factor, inv_factor,
        weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}